

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBAAseparate8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  uint32_t *puVar5;
  uint local_2c;
  uint32_t local_28;
  uint32_t _x;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  local_28 = h;
  _y_local = cp;
  do {
    local_2c = w;
    if (local_28 == 0) {
      return;
    }
    for (; 7 < local_2c; local_2c = local_2c - 8) {
      *_y_local = CONCAT13(*a,CONCAT12(*b,CONCAT11(*g,*r)));
      _y_local[1] = CONCAT13(a[1],CONCAT12(b[1],CONCAT11(g[1],r[1])));
      _y_local[2] = CONCAT13(a[2],CONCAT12(b[2],CONCAT11(g[2],r[2])));
      _y_local[3] = CONCAT13(a[3],CONCAT12(b[3],CONCAT11(g[3],r[3])));
      _y_local[4] = CONCAT13(a[4],CONCAT12(b[4],CONCAT11(g[4],r[4])));
      _y_local[5] = CONCAT13(a[5],CONCAT12(b[5],CONCAT11(g[5],r[5])));
      puVar1 = r + 7;
      puVar2 = g + 7;
      puVar3 = b + 7;
      puVar4 = a + 7;
      puVar5 = _y_local + 7;
      _y_local[6] = CONCAT13(a[6],CONCAT12(b[6],CONCAT11(g[6],r[6])));
      r = r + 8;
      g = g + 8;
      b = b + 8;
      a = a + 8;
      _y_local = _y_local + 8;
      *puVar5 = CONCAT13(*puVar4,CONCAT12(*puVar3,CONCAT11(*puVar2,*puVar1)));
    }
    if (local_2c != 0) {
      switch(local_2c) {
      case 7:
        *_y_local = CONCAT13(*a,CONCAT12(*b,CONCAT11(*g,*r)));
        r = r + 1;
        g = g + 1;
        b = b + 1;
        a = a + 1;
        _y_local = _y_local + 1;
      case 6:
        *_y_local = CONCAT13(*a,CONCAT12(*b,CONCAT11(*g,*r)));
        r = r + 1;
        g = g + 1;
        b = b + 1;
        a = a + 1;
        _y_local = _y_local + 1;
      case 5:
        *_y_local = CONCAT13(*a,CONCAT12(*b,CONCAT11(*g,*r)));
        r = r + 1;
        g = g + 1;
        b = b + 1;
        a = a + 1;
        _y_local = _y_local + 1;
      case 4:
        *_y_local = CONCAT13(*a,CONCAT12(*b,CONCAT11(*g,*r)));
        r = r + 1;
        g = g + 1;
        b = b + 1;
        a = a + 1;
        _y_local = _y_local + 1;
      case 3:
        *_y_local = CONCAT13(*a,CONCAT12(*b,CONCAT11(*g,*r)));
        r = r + 1;
        g = g + 1;
        b = b + 1;
        a = a + 1;
        _y_local = _y_local + 1;
      case 2:
        *_y_local = CONCAT13(*a,CONCAT12(*b,CONCAT11(*g,*r)));
        r = r + 1;
        g = g + 1;
        b = b + 1;
        a = a + 1;
        _y_local = _y_local + 1;
      case 1:
        *_y_local = CONCAT13(*a,CONCAT12(*b,CONCAT11(*g,*r)));
        r = r + 1;
        g = g + 1;
        b = b + 1;
        a = a + 1;
        _y_local = _y_local + 1;
      }
    }
    r = r + fromskew;
    g = g + fromskew;
    b = b + fromskew;
    a = a + fromskew;
    _y_local = _y_local + toskew;
    local_28 = local_28 - 1;
  } while( true );
}

Assistant:

DECLARESepPutFunc(putRGBAAseparate8bittile)
{
    (void)img;
    (void)x;
    (void)y;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, *cp++ = PACK4(*r++, *g++, *b++, *a++));
        SKEW4(r, g, b, a, fromskew);
        cp += toskew;
    }
}